

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spgmr.c
# Opt level: O2

int SUNLinSol_SPGMRSetGSType(SUNLinearSolver S,int gstype)

{
  int iVar1;
  
  iVar1 = -0x322;
  if (0xfffffffd < gstype - 3U) {
    if (S != (SUNLinearSolver)0x0) {
      *(int *)((long)S->content + 8) = gstype;
      return 0;
    }
    iVar1 = -0x321;
  }
  return iVar1;
}

Assistant:

int SUNLinSol_SPGMRSetGSType(SUNLinearSolver S, int gstype)
{
  /* Check for legal gstype */
  if ((gstype != SUN_MODIFIED_GS) && (gstype != SUN_CLASSICAL_GS)) {
    return(SUNLS_ILL_INPUT);
  }

  /* Check for non-NULL SUNLinearSolver */
  if (S == NULL) return(SUNLS_MEM_NULL);

  /* Set pretype */
  SPGMR_CONTENT(S)->gstype = gstype;
  return(SUNLS_SUCCESS);
}